

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

char * str_find(char *haystack,char *needle)

{
  char *in_RAX;
  long lVar1;
  char *pcVar2;
  char cVar3;
  
  do {
    if (*haystack == '\0') {
      return (char *)0x0;
    }
    cVar3 = *haystack;
    pcVar2 = needle;
    if (cVar3 != '\0') {
      lVar1 = 0;
      do {
        if (cVar3 != needle[lVar1]) break;
        cVar3 = haystack[lVar1 + 1];
        lVar1 = lVar1 + 1;
      } while (cVar3 != '\0');
      pcVar2 = needle + lVar1;
    }
    if (*pcVar2 == '\0') {
      in_RAX = haystack;
    }
    haystack = haystack + 1;
    if (*pcVar2 == '\0') {
      return in_RAX;
    }
  } while( true );
}

Assistant:

const char *str_find(const char *haystack, const char *needle)
{
	while(*haystack) /* native implementation */
	{
		const char *a = haystack;
		const char *b = needle;
		while(*a && *b && *a == *b)
		{
			a++;
			b++;
		}
		if(!(*b))
			return haystack;
		haystack++;
	}

	return 0;
}